

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_sse_sum_sse2.c
# Opt level: O2

void aom_get_blk_sse_sum_sse2(int16_t *data,int stride,int bw,int bh,int *x_sum,int64_t *x2_sum)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar5;
  uint uVar6;
  undefined1 auVar4 [16];
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uStack_40;
  
  *x_sum = 0;
  *x2_sum = 0;
  if ((bh & 3U) != 0) {
LAB_002c11ea:
    aom_get_blk_sse_sum_c(data,stride,bw,bh,x_sum,x2_sum);
    return;
  }
  if (bw == 0x40) {
    if (0x10 < bh) {
      for (uVar2 = 0; uVar2 < (uint)bh; uVar2 = uVar2 + 0x10) {
        sse_sum_wd8_sse2(data,stride,0x10,x_sum,x2_sum,8);
        data = data + (long)stride * 0x10;
      }
      return;
    }
    uStack_40 = 8;
  }
  else if ((bw == 8) || (bw == 0x10)) {
    uStack_40 = (uint)bw >> 3;
  }
  else {
    if (bw != 0x20) {
      if (bw == 4) {
        iVar1 = 0;
        if (0 < bh >> 1) {
          iVar1 = bh >> 1;
        }
        auVar4 = (undefined1  [16])0x0;
        iVar8 = 0;
        iVar9 = 0;
        iVar10 = 0;
        iVar11 = 0;
        while( true ) {
          bVar3 = iVar1 == 0;
          iVar1 = iVar1 + -1;
          uVar7 = auVar4._12_4_;
          uVar5 = auVar4._4_4_;
          uVar6 = auVar4._8_4_;
          if (bVar3) break;
          auVar13._8_8_ = *(undefined8 *)(data + stride);
          auVar13._0_8_ = *(undefined8 *)data;
          auVar12 = pmaddwd(auVar13,_DAT_004685f0);
          auVar13 = pmaddwd(auVar13,auVar13);
          iVar8 = iVar8 + auVar12._0_4_;
          iVar9 = iVar9 + auVar12._4_4_;
          iVar10 = iVar10 + auVar12._8_4_;
          iVar11 = iVar11 + auVar12._12_4_;
          auVar4._0_4_ = auVar4._0_4_ + auVar13._0_4_;
          auVar4._4_4_ = uVar5 + auVar13._4_4_;
          auVar4._8_4_ = uVar6 + auVar13._8_4_;
          auVar4._12_4_ = uVar7 + auVar13._12_4_;
          data = data + stride * 2;
        }
        *x_sum = iVar11 + iVar9 + iVar10 + iVar8;
        *x2_sum = (ulong)uVar7 + (ulong)uVar5 + (ulong)uVar6 + (auVar4._0_8_ & 0xffffffff);
        return;
      }
      goto LAB_002c11ea;
    }
    if (bh < 0x21) {
      uStack_40 = 4;
    }
    else {
      bh = 0x20;
      uStack_40 = 4;
      sse_sum_wd8_sse2(data,stride,0x20,x_sum,x2_sum,4);
      data = data + (stride << 5);
    }
  }
  sse_sum_wd8_sse2(data,stride,bh,x_sum,x2_sum,uStack_40);
  return;
}

Assistant:

void aom_get_blk_sse_sum_sse2(const int16_t *data, int stride, int bw, int bh,
                              int *x_sum, int64_t *x2_sum) {
  *x_sum = 0;
  *x2_sum = 0;

  if ((bh & 3) == 0) {
    switch (bw) {
      case 4: sse_sum_wd4_sse2(data, stride, bh, x_sum, x2_sum); break;
      case 8:
      case 16:
        sse_sum_wd8_sse2(data, stride, bh, x_sum, x2_sum, bw >> 3);
        break;
        // For widths 32 and 64, the registers may overflow. So compute
        // partial widths at a time.
      case 32:
        if (bh <= 32) {
          sse_sum_wd8_sse2(data, stride, bh, x_sum, x2_sum, bw >> 3);
          break;
        } else {
          sse_sum_wd8_sse2(data, stride, 32, x_sum, x2_sum, bw >> 3);
          sse_sum_wd8_sse2(data + 32 * stride, stride, 32, x_sum, x2_sum,
                           bw >> 3);
          break;
        }

      case 64:
        if (bh <= 16) {
          sse_sum_wd8_sse2(data, stride, bh, x_sum, x2_sum, bw >> 3);
          break;
        } else {
          for (int i = 0; i < bh; i += 16)
            sse_sum_wd8_sse2(data + i * stride, stride, 16, x_sum, x2_sum,
                             bw >> 3);
          break;
        }

      default: aom_get_blk_sse_sum_c(data, stride, bw, bh, x_sum, x2_sum);
    }
  } else {
    aom_get_blk_sse_sum_c(data, stride, bw, bh, x_sum, x2_sum);
  }
}